

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswInt.h
# Opt level: O1

int Ssw_ObjSatNum(Ssw_Sat_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  size_t __size;
  int iVar5;
  int iVar6;
  
  pVVar3 = p->vSatVars;
  uVar1 = pObj->Id;
  if ((int)uVar1 < pVVar3->nSize) goto LAB_0061f9f5;
  iVar2 = pVVar3->nCap;
  iVar5 = iVar2 * 2;
  iVar6 = (int)((long)(int)uVar1 + 1);
  if ((int)uVar1 < iVar5) {
    if (iVar2 < iVar5 && iVar2 <= (int)uVar1) {
      if (pVVar3->pArray == (int *)0x0) {
        piVar4 = (int *)malloc((long)iVar2 << 3);
      }
      else {
        piVar4 = (int *)realloc(pVVar3->pArray,(long)iVar2 << 3);
      }
      pVVar3->pArray = piVar4;
LAB_0061f9c1:
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar3->nCap = iVar5;
    }
  }
  else if (iVar2 <= (int)uVar1) {
    __size = ((long)(int)uVar1 + 1) * 4;
    if (pVVar3->pArray == (int *)0x0) {
      piVar4 = (int *)malloc(__size);
    }
    else {
      piVar4 = (int *)realloc(pVVar3->pArray,__size);
    }
    pVVar3->pArray = piVar4;
    iVar5 = iVar6;
    goto LAB_0061f9c1;
  }
  iVar2 = pVVar3->nSize;
  if (iVar2 <= (int)uVar1) {
    memset(pVVar3->pArray + iVar2,0,(ulong)(uVar1 - iVar2) * 4 + 4);
  }
  pVVar3->nSize = iVar6;
LAB_0061f9f5:
  if ((-1 < (int)uVar1) && ((int)uVar1 < pVVar3->nSize)) {
    return pVVar3->pArray[uVar1];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int  Ssw_ObjSatNum( Ssw_Sat_t * p, Aig_Obj_t * pObj )             { return Vec_IntGetEntry( p->vSatVars, pObj->Id );  }